

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool __thiscall argo::json::operator<=(json *this,char *s)

{
  int iVar1;
  string *psVar2;
  char *local_30 [4];
  
  psVar2 = operator_cast_to_string_(this);
  std::__cxx11::string::string((string *)local_30,(string *)psVar2);
  iVar1 = strcmp(local_30[0],s);
  std::__cxx11::string::~string((string *)local_30);
  return iVar1 < 1;
}

Assistant:

bool json::operator<=(const char *s) const
{
    return strcmp(static_cast<string>(*this).c_str(), s) <= 0;
}